

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.h
# Opt level: O3

void __thiscall Assimp::ASE::Mesh::~Mesh(Mesh *this)

{
  pointer paVar1;
  void *pvVar2;
  pointer paVar3;
  pointer pFVar4;
  long lVar5;
  
  std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::~vector(&this->mBones);
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::~vector
            (&this->mBoneVertices);
  paVar1 = (this->mVertexColors).
           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar1 != (pointer)0x0) {
    operator_delete(paVar1);
  }
  lVar5 = 0x248;
  do {
    pvVar2 = *(void **)((long)&(this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar5);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0x188);
  BaseNode::~BaseNode(&this->super_BaseNode);
  paVar3 = (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mNormals.
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3);
  }
  pFVar4 = (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces.
           super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pFVar4 != (pointer)0x0) {
    operator_delete(pFVar4);
  }
  paVar3 = (this->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mPositions.
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar3 != (pointer)0x0) {
    operator_delete(paVar3);
    return;
  }
  return;
}

Assistant:

Mesh() = delete;